

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator>>=(BN *this,size_t shift)

{
  ushort *puVar1;
  pointer puVar2;
  byte bVar3;
  ulong t;
  ulong uVar4;
  ushort *puVar5;
  long lVar6;
  bool bVar7;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> _Stack_38;
  
  if (shift != 0) {
    t = shift >> 4;
    if ((shift & 0xf) == 0) {
      divbt((BN *)&_Stack_38,this,t);
      operator=(this,(BN *)&_Stack_38);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&_Stack_38);
    }
    else {
      puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (long)puVar2 - (long)puVar1 >> 1;
      if (uVar4 < t || uVar4 - t == 0) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,0);
        *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start = 0;
      }
      else {
        puVar5 = puVar1;
        lVar6 = uVar4 + ~t;
        while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
          bVar3 = (byte)shift & 0xf;
          *puVar5 = puVar5[t] >> bVar3 | puVar5[t + 1] << 0x10 - bVar3;
          puVar5 = puVar5 + 1;
        }
        puVar1[uVar4 + ~t] = puVar2[-1] >> (sbyte)(shift & 0xf);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,uVar4 - t);
        anon_unknown.dwarf_1add5::Norm(&this->ba);
      }
    }
  }
  return this;
}

Assistant:

BN& BN::operator >>= (size_t shift) {
    if (shift == 0)
        return *this;
    size_t baseshift = shift / bz8;
    size_t realshift = shift - baseshift * bz8;

    if (realshift == 0)
        return *this = divbt(baseshift);

    if (baseshift >= ba.size()) {
        ba.resize(0);
        ba[0] = 0;
        return *this;
    }

    for (size_t i = 0; i < ba.size() - baseshift - 1; ++i) {
        ba[i] =
            (ba[i + baseshift] >> realshift) |
            (ba[i + baseshift + 1] << (bz8 - realshift));
    }
    ba[ba.size() - baseshift - 1] = ba.back() >> realshift;
    ba.resize(ba.size() - baseshift);

    Norm(ba);
    return *this;
}